

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

bool __thiscall QFileSystemEntry::isRelative(QFileSystemEntry *this)

{
  bool bVar1;
  QFileSystemEntry *in_stack_00000010;
  
  bVar1 = isAbsolute(in_stack_00000010);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool QFileSystemEntry::isRelative() const
{
    return !isAbsolute();
}